

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O0

void bov_points_draw_aux(bov_window_t *window,bov_points_t *points,bov_points_drawing_mode_t mode,
                        GLint start,GLsizei count)

{
  GLenum GVar1;
  GLsizei local_24;
  GLenum primitive;
  GLsizei count_local;
  GLint start_local;
  bov_points_drawing_mode_t mode_local;
  bov_points_t *points_local;
  bov_window_t *window_local;
  
  if (start < points->vboLen) {
    if ((points->vboLen < count + start) || (local_24 = count, start + count < count)) {
      local_24 = points->vboLen - start;
    }
    GVar1 = switch_rasterizer_with_mode(window,points,mode);
    (*glad_glDrawArrays)(GVar1,start,local_24);
  }
  return;
}

Assistant:

void bov_points_draw_aux(bov_window_t* window,
                         const bov_points_t* points,
                         bov_points_drawing_mode_t mode,
                         GLint start,
                         GLsizei count)
{
	if(start>=points->vboLen)
		return;

	if(count + start > points->vboLen || start + count < count) { //< don't forget to detect overflow
		count = points->vboLen - start;
	}

	GLenum primitive = switch_rasterizer_with_mode(window, points, mode);
	glDrawArrays(primitive, start, count);
	// glBindVertexArray(0);
}